

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexTriangleKernelIter::applyConst
          (PtexTriangleKernelIter *this,float *dst,void *data,DataType dt,int nChan)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  iVar7 = this->v1;
  iVar6 = this->v2;
  if (iVar7 == iVar6) {
    fVar10 = this->weight;
  }
  else {
    fVar1 = this->A;
    fVar2 = this->u;
    fVar3 = this->v;
    fVar4 = this->B;
    fVar5 = this->C;
    fVar10 = this->weight;
    do {
      iVar9 = this->rowlen - iVar7;
      iVar8 = iVar9 - this->w2;
      if (iVar8 < this->u1) {
        iVar8 = this->u1;
      }
      iVar9 = iVar9 - this->w1;
      if (this->u2 < iVar9) {
        iVar9 = this->u2;
      }
      if (iVar8 < iVar9) {
        fVar12 = (float)iVar8 - fVar2;
        fVar11 = (float)iVar7 - fVar3;
        fVar14 = fVar1 * fVar12 * fVar12 + (fVar4 * fVar12 + fVar11 * fVar5) * fVar11;
        fVar13 = (fVar12 + fVar12 + 1.0) * fVar1 + fVar11 * fVar4;
        fVar11 = this->wscale;
        fVar12 = fVar10;
        do {
          if (fVar14 < 1.0) {
            fVar10 = expf(fVar14 * -6.125);
            fVar10 = fVar10 * fVar11 + fVar12;
            this->weight = fVar10;
            fVar12 = fVar10;
          }
          fVar14 = fVar14 + fVar13;
          fVar13 = fVar13 + fVar1 + fVar1;
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar9);
        iVar6 = this->v2;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar6);
  }
  iVar7 = 0;
  if ((uint)nChan < 5) {
    iVar7 = nChan * 4;
  }
  (**(code **)(PtexUtils::applyConstFunctions + (long)(int)(iVar7 + dt) * 8))(fVar10,dst,data,nChan)
  ;
  return;
}

Assistant:

void PtexTriangleKernelIter::applyConst(float* dst, void* data, DataType dt, int nChan)
{
    // iterate over texel locations and calculate weight as if texture weren't const
    float DDQ = 2.0f*A;
    for (int vi = v1; vi != v2; vi++) {
        int xw = rowlen - vi;
        int x1 = PtexUtils::max(u1, xw-w2);
        int x2 = PtexUtils::min(u2, xw-w1);
        float U = (float)x1 - u;
        float V = (float)vi - v;
        float DQ = A*(2.0f*U+1.0f)+B*V;
        float Q = A*U*U + (B*U + C*V)*V;
        for (int x = x1; x < x2; x++) {
            if (Q < 1.0f) {
                weight += gaussian(Q)*wscale;
            }
            Q += DQ;
            DQ += DDQ;
        }
    }

    // apply weight to single texel value
    PtexUtils::applyConst(weight, dst, data, dt, nChan);
}